

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::auto_insert_clock_enable(Generator *top)

{
  undefined1 local_88 [8];
  InsertClockIRVisitor visitor;
  Generator *top_local;
  
  visitor.top_ = top;
  InsertClockIRVisitor::InsertClockIRVisitor((InsertClockIRVisitor *)local_88,top);
  IRVisitor::visit_root((IRVisitor *)local_88,&(visitor.top_)->super_IRNode);
  InsertClockIRVisitor::~InsertClockIRVisitor((InsertClockIRVisitor *)local_88);
  return;
}

Assistant:

void auto_insert_clock_enable(Generator* top) {
    InsertClockIRVisitor visitor(top);
    visitor.visit_root(top);
}